

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5Array.cpp
# Opt level: O2

void __thiscall
Js::ES5Array::ExtractSnapObjectDataInto(ES5Array *this,SnapObject *objData,SlabAllocator *alloc)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint32 key;
  SnapES5ArrayInfo *addtlInfo;
  SnapES5ArrayGetterSetterEntry *pSVar5;
  void *local_60;
  void *descriptorValidationToken;
  SnapArrayInfo<void_*> *local_50;
  SlabAllocator *local_48;
  ulong local_40;
  IndexPropertyDescriptor *local_38;
  IndexPropertyDescriptor *descriptor;
  
  descriptorValidationToken = objData;
  local_50 = TTD::NSSnapObjects::ExtractArrayValues<void*>(&this->super_JavascriptArray,alloc);
  addtlInfo = (SnapES5ArrayInfo *)TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<32ul>(alloc);
  uVar2 = (this->super_JavascriptArray).super_ArrayObject.length;
  bVar4 = IsLengthWritable(this);
  addtlInfo->IsLengthWritable = bVar4;
  addtlInfo->GetterSetterCount = 0;
  local_40 = (ulong)(uVar2 + 1);
  local_48 = alloc;
  pSVar5 = TTD::SlabAllocatorBase<0>::
           SlabReserveArraySpace<TTD::NSSnapObjects::SnapES5ArrayGetterSetterEntry>(alloc,local_40);
  addtlInfo->GetterSetterEntries = pSVar5;
  local_38 = (IndexPropertyDescriptor *)0x0;
  local_60 = (void *)0x0;
  key = 0xffffffff;
  while( true ) {
    key = GetNextDescriptor(this,key,&local_38,&local_60);
    if (uVar2 <= key) break;
    bVar1 = local_38->Attributes;
    if ((bVar1 & 8) == 0) {
      pSVar5 = addtlInfo->GetterSetterEntries;
      uVar3 = addtlInfo->GetterSetterCount;
      addtlInfo->GetterSetterCount = uVar3 + 1;
      pSVar5[uVar3].Index = key;
      pSVar5[uVar3].Attributes = bVar1;
      pSVar5[uVar3].Getter = (TTDVar)0x0;
      pSVar5[uVar3].Getter = (local_38->Getter).ptr;
      pSVar5[uVar3].Setter = (TTDVar)0x0;
      pSVar5[uVar3].Setter = (local_38->Setter).ptr;
    }
  }
  if ((ulong)addtlInfo->GetterSetterCount == 0) {
    TTD::SlabAllocatorBase<0>::
    SlabAbortArraySpace<TTD::NSSnapObjects::SnapES5ArrayGetterSetterEntry>(local_48,local_40);
    addtlInfo->GetterSetterEntries = (SnapES5ArrayGetterSetterEntry *)0x0;
  }
  else {
    TTD::SlabAllocatorBase<0>::
    SlabCommitArraySpace<TTD::NSSnapObjects::SnapES5ArrayGetterSetterEntry>
              (local_48,(ulong)addtlInfo->GetterSetterCount,local_40);
  }
  addtlInfo->BasicArrayData = local_50;
  TTD::NSSnapObjects::
  SnapObjectSetAddtlInfoAs<TTD::NSSnapObjects::SnapES5ArrayInfo*,(TTD::NSSnapObjects::SnapObjectType)22>
            ((SnapObject *)descriptorValidationToken,addtlInfo);
  return;
}

Assistant:

void ES5Array::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapArrayInfo<TTD::TTDVar>* sai = TTD::NSSnapObjects::ExtractArrayValues<TTD::TTDVar>(this, alloc);

        TTD::NSSnapObjects::SnapES5ArrayInfo* es5ArrayInfo = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapES5ArrayInfo>();

        //
        //TODO: reserving memory for entire length might be a problem if we have very large sparse arrays.
        //

        uint32 length = this->GetLength();

        es5ArrayInfo->IsLengthWritable = this->IsLengthWritable();
        es5ArrayInfo->GetterSetterCount = 0;
        es5ArrayInfo->GetterSetterEntries = alloc.SlabReserveArraySpace<TTD::NSSnapObjects::SnapES5ArrayGetterSetterEntry>(length + 1); //ensure we don't do a 0 reserve

        uint32 descriptorIndex = Js::JavascriptArray::InvalidIndex;
        IndexPropertyDescriptor* descriptor = nullptr;
        void* descriptorValidationToken = nullptr;

        do
        {
            descriptorIndex = this->GetNextDescriptor(descriptorIndex, &descriptor, &descriptorValidationToken);
            if(descriptorIndex == Js::JavascriptArray::InvalidIndex || descriptorIndex >= length)
            {
                break;
            }

            if((descriptor->Attributes & PropertyDeleted) != PropertyDeleted)
            {
                TTD::NSSnapObjects::SnapES5ArrayGetterSetterEntry* entry = es5ArrayInfo->GetterSetterEntries + es5ArrayInfo->GetterSetterCount;
                es5ArrayInfo->GetterSetterCount++;

                entry->Index = (uint32)descriptorIndex;
                entry->Attributes = descriptor->Attributes;

                entry->Getter = nullptr;
                if(descriptor->Getter != nullptr)
                {
                    entry->Getter = descriptor->Getter;
                }

                entry->Setter = nullptr;
                if(descriptor->Setter != nullptr)
                {
                    entry->Setter = descriptor->Setter;
                }
            }

        } while(true);

        if(es5ArrayInfo->GetterSetterCount != 0)
        {
            alloc.SlabCommitArraySpace<TTD::NSSnapObjects::SnapES5ArrayGetterSetterEntry>(es5ArrayInfo->GetterSetterCount, length + 1);
        }
        else
        {
            alloc.SlabAbortArraySpace<TTD::NSSnapObjects::SnapES5ArrayGetterSetterEntry>(length + 1);
            es5ArrayInfo->GetterSetterEntries = nullptr;
        }

        es5ArrayInfo->BasicArrayData = sai;

        TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapES5ArrayInfo*, TTD::NSSnapObjects::SnapObjectType::SnapES5ArrayObject>(objData, es5ArrayInfo);
    }